

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void add_tokens(VARR_token_t *to,VARR_token_t *from)

{
  short sVar1;
  ushort uVar2;
  short sVar3;
  short *psVar4;
  short *psVar5;
  ushort *puVar6;
  VARR_char *pVVar7;
  VARR_stream_t *pVVar8;
  size_t sVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  c2m_ctx_t t;
  token_t ptVar14;
  token_t ptVar15;
  undefined4 *puVar16;
  void *__ptr;
  char *pcVar17;
  uint uVar18;
  undefined8 in_RCX;
  c2m_ctx_t pcVar19;
  MIR_context_t pMVar20;
  char *extraout_RDX;
  c2m_ctx_t pcVar21;
  MIR_context_t pMVar22;
  undefined8 *extraout_RDX_00;
  c2m_ctx_t pcVar23;
  uint uVar24;
  c2m_ctx_t c2m_ctx;
  c2m_ctx_t pcVar26;
  long lVar27;
  ulong uVar28;
  char *pcVar29;
  pos_t pos;
  c2m_ctx_t pcVar25;
  
  pcVar23 = (c2m_ctx_t)from;
  pcVar25 = (c2m_ctx_t)to;
  if (from != (VARR_token_t *)0x0) {
    if (from->els_num != 0) {
      uVar28 = 0;
      do {
        if (from->varr == (token_t *)0x0) {
          add_tokens_cold_1();
          goto LAB_0019233e;
        }
        pcVar23 = (c2m_ctx_t)from->varr[uVar28];
        pcVar25 = (c2m_ctx_t)to;
        add_token(to,(token_t)pcVar23);
        uVar28 = uVar28 + 1;
      } while (uVar28 < from->els_num);
    }
    return;
  }
LAB_0019233e:
  add_tokens_cold_2();
  t = pcVar23;
  c2m_ctx = pcVar25;
  if (pcVar23 != (c2m_ctx_t)0x0) {
    uVar18 = (uint)pcVar23->ctx;
    if (0 < (int)uVar18) {
      pMVar20 = (MIR_context_t)(ulong)(uVar18 & 0x7fffffff);
      do {
        pMVar22 = (MIR_context_t)((long)&pMVar20[-1].wrapper_end_addr + 7);
        lVar27 = pcVar23->env[0].__jmpbuf[0];
        if ((lVar27 == 0) || (pcVar23->ctx <= pMVar22)) {
          copy_and_push_back_cold_1();
          goto LAB_001923be;
        }
        pos.lno = (int)in_RCX;
        pos.ln_pos = (int)((ulong)in_RCX >> 0x20);
        pos.fname = extraout_RDX;
        t = (c2m_ctx_t)copy_token(pcVar25,*(token_t *)(lVar27 + (long)pMVar22 * 8),pos);
        c2m_ctx = (c2m_ctx_t)pcVar25->buffered_tokens;
        unget_next_pptoken(c2m_ctx,(token_t)t);
        bVar10 = (MIR_context_t)0x1 < pMVar20;
        pMVar20 = pMVar22;
      } while (bVar10);
    }
    return;
  }
LAB_001923be:
  copy_and_push_back_cold_2();
  pcVar23 = t;
  pcVar25 = c2m_ctx;
  if (t != (c2m_ctx_t)0x0) {
    pcVar19 = (c2m_ctx_t)t->ctx;
    if (0 < (int)pcVar19) {
      pcVar21 = (c2m_ctx_t)((ulong)pcVar19 & 0xffffffff);
      do {
        lVar27 = t->env[0].__jmpbuf[0];
        if (lVar27 == 0) goto LAB_001927ae;
        iVar13 = (int)pcVar21;
        pcVar26 = (c2m_ctx_t)(ulong)(iVar13 - 1);
        if (pcVar19 <= pcVar26) goto LAB_001927ae;
        psVar4 = *(short **)(lVar27 + (long)pcVar26 * 8);
        if (*psVar4 == 0x142) {
          if ((iVar13 == 1) || (uVar18 = (uint)pcVar19, (int)uVar18 <= iVar13)) goto LAB_001927c2;
          if (pcVar19 <= pcVar21) {
            do_concat_cold_2();
LAB_0019280a:
            do_concat_cold_10();
LAB_0019280f:
            do_concat_cold_8();
LAB_00192814:
            do_concat_cold_7();
LAB_00192819:
            do_concat_cold_9();
LAB_0019281e:
            do_concat_cold_14();
LAB_00192823:
            __assert_fail("cs->f == NULL && cs->f == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x42a,"void remove_string_stream(c2m_ctx_t)");
          }
          sVar1 = **(short **)(lVar27 + (long)pcVar21 * 8);
          if ((sVar1 == 0x20) || (sVar1 == 10)) {
            pcVar21 = (c2m_ctx_t)(ulong)(iVar13 + 1);
          }
          pcVar26 = (c2m_ctx_t)(ulong)(iVar13 - 2);
          if (pcVar19 <= pcVar26) goto LAB_001927bd;
          sVar1 = **(short **)(lVar27 + (long)pcVar26 * 8);
          if ((sVar1 == 0x20) || (sVar1 == 10)) {
            pcVar26 = (c2m_ctx_t)(ulong)(iVar13 - 3);
          }
          iVar13 = (int)pcVar26;
          if ((iVar13 < 0) || (uVar24 = (uint)pcVar21, uVar18 <= uVar24)) {
LAB_001927e6:
            __assert_fail("k >= 0 && j < len",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0xaae,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
          }
          if (pcVar19 <= pcVar21) goto LAB_001927b8;
          if (pcVar19 <= pcVar26) {
            do_concat_cold_5();
            goto LAB_001927e6;
          }
          psVar5 = *(short **)(lVar27 + (long)pcVar21 * 8);
          puVar6 = *(ushort **)(lVar27 + (long)pcVar26 * 8);
          sVar1 = *psVar5;
          uVar2 = *puVar6;
          pcVar23 = (c2m_ctx_t)(ulong)uVar2;
          if ((sVar1 != 0x141) && (uVar2 != 0x141)) {
            pVVar7 = c2m_ctx->temp_string;
            if ((pVVar7 == (VARR_char *)0x0) || (pVVar7->varr == (char *)0x0)) goto LAB_0019280a;
            pVVar7->els_num = 0;
            add_to_temp_string(c2m_ctx,*(char **)(puVar6 + 0x14));
            add_to_temp_string(c2m_ctx,*(char **)(psVar5 + 0x14));
            reverse(c2m_ctx->temp_string);
            if (c2m_ctx->temp_string == (VARR_char *)0x0) goto LAB_00192819;
            set_string_stream(c2m_ctx,c2m_ctx->temp_string->varr,*(pos_t *)(puVar6 + 4),
                              (_func_void_char_ptr_VARR_char_ptr *)0x0);
            ptVar14 = get_next_pptoken_1(c2m_ctx,0);
            do {
              ptVar15 = get_next_pptoken_1(c2m_ctx,0);
            } while (*(short *)ptVar15 == 0x147);
            if (*(short *)ptVar15 != 0x13d) {
              reverse(c2m_ctx->temp_string);
              error(c2m_ctx,0x1c1a87,*(char **)(puVar6 + 4),*(undefined8 *)(puVar6 + 8));
              if (c2m_ctx->cs->f != (FILE *)0x0) goto LAB_00192823;
              pVVar8 = c2m_ctx->streams;
              if (((pVVar8 == (VARR_stream_t *)0x0) || (pVVar8->varr == (stream_t *)0x0)) ||
                 (sVar9 = pVVar8->els_num, sVar9 == 0)) goto LAB_0019280f;
              pVVar8->els_num = sVar9 - 1;
              free_stream(pVVar8->varr[sVar9 - 1]);
              pVVar8 = c2m_ctx->streams;
              if (((pVVar8 == (VARR_stream_t *)0x0) || (pVVar8->varr == (stream_t *)0x0)) ||
                 (pVVar8->els_num == 0)) goto LAB_00192814;
              c2m_ctx->cs = pVVar8->varr[pVVar8->els_num - 1];
            }
            pcVar25 = t;
            del_tokens((VARR_token_t *)t,iVar13 + 1,uVar24 - iVar13);
            lVar27 = t->env[0].__jmpbuf[0];
            if ((lVar27 != 0) && (pcVar19 = (c2m_ctx_t)t->ctx, pcVar26 < pcVar19)) {
              *(token_t *)(lVar27 + (long)pcVar26 * 8) = ptVar14;
              goto LAB_0019275a;
            }
            goto LAB_001927b3;
          }
          if (sVar1 == 0x141) {
            uVar24 = uVar24 + 1;
            pcVar25 = (c2m_ctx_t)(ulong)uVar24;
            if (uVar18 <= uVar24) goto LAB_00192685;
            if ((c2m_ctx_t)(ulong)uVar24 < pcVar19) {
              sVar3 = **(short **)(lVar27 + (long)(ulong)uVar24 * 8);
              if ((sVar3 == 0x20) || (sVar3 == 10)) {
                pcVar21 = (c2m_ctx_t)(ulong)uVar24;
              }
              goto LAB_00192685;
            }
LAB_00192847:
            do_concat_cold_11();
            goto LAB_0019284c;
          }
          pcVar21 = (c2m_ctx_t)(ulong)(uVar24 - 1);
LAB_00192685:
          if (uVar2 == 0x141) {
            if (iVar13 == 0) {
              pcVar26 = (c2m_ctx_t)0x0;
            }
            else {
              pcVar23 = (c2m_ctx_t)(ulong)(iVar13 - 1U);
              if (pcVar19 <= pcVar23) {
                do_concat_cold_12();
                goto LAB_00192847;
              }
              sVar3 = **(short **)(lVar27 + (long)pcVar23 * 8);
              if ((sVar3 == 0x20) || (sVar3 == 10)) {
                pcVar26 = (c2m_ctx_t)(ulong)(iVar13 - 1U);
              }
            }
            if (sVar1 == 0x141) {
              del_tokens((VARR_token_t *)t,(int)pcVar26,(int)pcVar21 - (int)pcVar26);
              uVar11 = *(undefined8 *)(psVar4 + 4);
              uVar12 = *(undefined8 *)(psVar4 + 8);
              pcVar25 = c2m_ctx;
              puVar16 = (undefined4 *)reg_malloc(c2m_ctx,0x30);
              *puVar16 = 0x20;
              *(undefined8 *)(puVar16 + 2) = uVar11;
              *(undefined8 *)(puVar16 + 4) = uVar12;
              *(char **)(puVar16 + 10) = "";
              puVar16[6] = 0;
              *(undefined8 *)(puVar16 + 8) = 0;
              lVar27 = t->env[0].__jmpbuf[0];
              if ((lVar27 != 0) && (pcVar19 = (c2m_ctx_t)t->ctx, pcVar26 < pcVar19)) {
                *(undefined4 **)(lVar27 + (long)pcVar26 * 8) = puVar16;
                goto LAB_0019275a;
              }
              goto LAB_0019281e;
            }
          }
          else {
            pcVar26 = (c2m_ctx_t)(ulong)(iVar13 + 1);
          }
          pcVar25 = t;
          del_tokens((VARR_token_t *)t,(int)pcVar26,((int)pcVar21 - (int)pcVar26) + 1);
          pcVar19 = (c2m_ctx_t)t->ctx;
        }
LAB_0019275a:
        pcVar21 = pcVar26;
      } while (0 < (int)pcVar21);
      if (0 < (int)pcVar19) {
        pMVar20 = (MIR_context_t)((ulong)pcVar19 & 0xffffffff);
        do {
          pMVar22 = (MIR_context_t)((long)&pMVar20[-1].wrapper_end_addr + 7);
          lVar27 = t->env[0].__jmpbuf[0];
          if ((lVar27 == 0) || (t->ctx <= pMVar22)) {
            do_concat_cold_13();
LAB_001927ae:
            do_concat_cold_1();
LAB_001927b3:
            do_concat_cold_6();
LAB_001927b8:
            do_concat_cold_4();
LAB_001927bd:
            do_concat_cold_3();
LAB_001927c2:
            __assert_fail("k >= 0 && j < len",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0xaa9,"VARR_token_t *do_concat(c2m_ctx_t, VARR_token_t *)");
          }
          *(undefined2 *)(*(long *)(lVar27 + (long)pMVar22 * 8) + 2) = 1;
          bVar10 = (MIR_context_t)0x1 < pMVar20;
          pMVar20 = pMVar22;
        } while (bVar10);
      }
    }
    return;
  }
LAB_0019284c:
  do_concat_cold_15();
  __ptr = (void *)pcVar25->env[0].__jmpbuf[0];
  if (__ptr != (void *)0x0) {
    pMVar22 = pcVar25->ctx;
    pMVar20 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
    if ((MIR_context_t)((pos_t *)&pcVar25->options)->fname < pMVar20) {
      pcVar29 = (char *)((long)&pMVar20->gen_ctx + ((ulong)pMVar20 >> 1));
      __ptr = realloc(__ptr,(long)pcVar29 * 8);
      pcVar25->env[0].__jmpbuf[0] = (long)__ptr;
      ((pos_t *)&pcVar25->options)->fname = pcVar29;
      pMVar22 = pcVar25->ctx;
      pMVar20 = (MIR_context_t)((long)&pMVar22->gen_ctx + 1);
    }
    pcVar25->ctx = pMVar20;
    *(c2m_ctx_t *)((long)__ptr + (long)pMVar22 * 8) = pcVar23;
    return;
  }
  VARR_macro_call_tpush_cold_1();
  *extraout_RDX_00 = 0;
  if ((*(short *)&pcVar23->ctx != 0x102) && (*(short *)&pcVar23->ctx != 0x13e)) {
    __assert_fail("t->code == T_STR || t->code == T_HEADER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x99b,"const char *get_include_fname(c2m_ctx_t, token_t, const char **)");
  }
  pcVar29 = *(char **)(pcVar23->env[0].__jmpbuf[2] + 0x20);
  if (*pcVar29 != '/') {
    if (*(char *)pcVar23->env[0].__jmpbuf[3] == '\"') {
      pcVar17 = pcVar25->cs->fname;
      if (pcVar17 != (char *)0x0) {
        pcVar17 = get_full_name(pcVar25,pcVar17,pcVar29,0);
        iVar13 = file_found_p(pcVar17);
        if (iVar13 != 0) {
LAB_001929f9:
          uniq_cstr(pcVar25,pcVar17);
          return;
        }
      }
      pcVar17 = *pcVar25->header_dirs;
      if (pcVar17 != (char *)0x0) {
        lVar27 = 8;
        do {
          pcVar17 = get_full_name(pcVar25,pcVar17,pcVar29,1);
          iVar13 = file_found_p(pcVar17);
          if (iVar13 != 0) goto LAB_001929f9;
          pcVar17 = *(char **)((long)pcVar25->header_dirs + lVar27);
          lVar27 = lVar27 + 8;
        } while (pcVar17 != (char *)0x0);
      }
    }
    lVar27 = 8;
    do {
      if ((*(char **)(&UNK_001e3ce8 + lVar27) != (char *)0x0) &&
         (iVar13 = strcmp(pcVar29,*(char **)(&UNK_001e3ce8 + lVar27)), iVar13 == 0)) {
        *extraout_RDX_00 = *(undefined8 *)((long)&standard_includes[0].name + lVar27);
        return;
      }
      lVar27 = lVar27 + 0x10;
    } while (lVar27 != 0xb8);
    pcVar17 = *pcVar25->system_header_dirs;
    if (pcVar17 != (char *)0x0) {
      lVar27 = 8;
      do {
        pcVar17 = get_full_name(pcVar25,pcVar17,pcVar29,1);
        iVar13 = file_found_p(pcVar17);
        if (iVar13 != 0) goto LAB_001929f9;
        pcVar17 = *(char **)((long)pcVar25->system_header_dirs + lVar27);
        lVar27 = lVar27 + 8;
      } while (pcVar17 != (char *)0x0);
    }
  }
  return;
}

Assistant:

static void add_tokens (VARR (token_t) * to, VARR (token_t) * from) {
  for (size_t i = 0; i < VARR_LENGTH (token_t, from); i++)
    add_token (to, VARR_GET (token_t, from, i));
}